

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_myinfo(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined8 uVar6;
  
  bVar4 = CheckCheatmode(true);
  if ((!bVar4) &&
     (puVar2 = (undefined8 *)(&players)[(long)consoleplayer * 0x54], puVar2 != (undefined8 *)0x0)) {
    if (puVar2[1] == 0) {
      uVar6 = (**(code **)*puVar2)(puVar2);
      puVar2[1] = uVar6;
    }
    pcVar3 = FName::NameData.NameArray[*(int *)(puVar2[1] + 0xa0)].Text;
    uVar1 = ((AActor *)(&players)[(long)consoleplayer * 0x54])->health;
    uVar5 = AActor::SpawnHealth((AActor *)(&players)[(long)consoleplayer * 0x54]);
    Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar3,(ulong)uVar1,(ulong)uVar5);
    PrintMiscActorInfo((AActor *)(&players)[(long)consoleplayer * 0x54]);
    return;
  }
  return;
}

Assistant:

CCMD(myinfo)
{
	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
		players[consoleplayer].mo->GetClass()->TypeName.GetChars(),
		players[consoleplayer].mo->health,
		players[consoleplayer].mo->SpawnHealth());
	PrintMiscActorInfo(players[consoleplayer].mo);
}